

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

iterator __thiscall CP::vector<int>::insert(vector<int> *this,iterator it,int *element)

{
  iterator piVar1;
  ulong uVar2;
  ulong local_30;
  size_t i;
  size_t pos;
  int *element_local;
  iterator it_local;
  vector<int> *this_local;
  
  piVar1 = begin(this);
  uVar2 = (long)it - (long)piVar1 >> 2;
  ensureCapacity(this,this->mSize + 1);
  for (local_30 = this->mSize; uVar2 < local_30; local_30 = local_30 - 1) {
    this->mData[local_30] = this->mData[local_30 - 1];
  }
  this->mData[uVar2] = *element;
  this->mSize = this->mSize + 1;
  piVar1 = begin(this);
  return piVar1 + uVar2;
}

Assistant:

iterator insert(iterator it,const T& element) {
      size_t pos = it - begin();
      ensureCapacity(mSize + 1);
      for(size_t i = mSize;i > pos;i--) {
        mData[i] = mData[i-1];
      }
      mData[pos] = element;
      mSize++;
      return begin()+pos;
    }